

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

XrResult ApiDumpLayerXrGetPlanePolygonBufferEXT
                   (XrPlaneDetectorEXT planeDetector,uint64_t planeId,uint32_t polygonBufferIndex,
                   XrPlaneDetectorPolygonBufferEXT *polygonBuffer)

{
  long lVar1;
  XrResult XVar2;
  iterator iVar3;
  ostream *poVar4;
  long lVar5;
  XrPlaneDetectorEXT planeDetector_local;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  contents;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  ostringstream oss_polygonBuffer;
  uint auStack_5f0 [88];
  ostringstream oss_planeDetector;
  uint auStack_478 [88];
  ostringstream oss_polygonBufferIndex;
  ostringstream oss_planeId;
  
  contents.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  contents.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  contents.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  planeDetector_local = planeDetector;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)&oss_planeDetector,&g_planedetectorext_dispatch_mutex);
  iVar3 = std::
          _Hashtable<XrPlaneDetectorEXT_T_*,_std::pair<XrPlaneDetectorEXT_T_*const,_XrGeneratedDispatchTable_*>,_std::allocator<std::pair<XrPlaneDetectorEXT_T_*const,_XrGeneratedDispatchTable_*>_>,_std::__detail::_Select1st,_std::equal_to<XrPlaneDetectorEXT_T_*>,_std::hash<XrPlaneDetectorEXT_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&g_planedetectorext_dispatch_map._M_h,&planeDetector_local);
  if (iVar3.
      super__Node_iterator_base<std::pair<XrPlaneDetectorEXT_T_*const,_XrGeneratedDispatchTable_*>,_false>
      ._M_cur == (__node_type *)0x0) {
    lVar5 = 0;
  }
  else {
    lVar5 = *(long *)((long)iVar3.
                            super__Node_iterator_base<std::pair<XrPlaneDetectorEXT_T_*const,_XrGeneratedDispatchTable_*>,_false>
                            ._M_cur + 0x10);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&oss_planeDetector);
  if (iVar3.
      super__Node_iterator_base<std::pair<XrPlaneDetectorEXT_T_*const,_XrGeneratedDispatchTable_*>,_false>
      ._M_cur == (__node_type *)0x0) {
    XVar2 = XR_ERROR_VALIDATION_FAILURE;
  }
  else {
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],char_const(&)[27],char_const(&)[1]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&contents,(char (*) [9])"XrResult",(char (*) [27])"xrGetPlanePolygonBufferEXT",
               (char (*) [1])0x20fb54);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_planeDetector);
    lVar1 = *(long *)((long)&_oss_planeDetector[-1].super___mutex_base._M_mutex + 0x10);
    *(uint *)((long)auStack_478 + lVar1) = *(uint *)((long)auStack_478 + lVar1) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&oss_planeDetector);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[19],char_const(&)[14],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&contents,(char (*) [19])"XrPlaneDetectorEXT",(char (*) [14])"planeDetector",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_planeId);
    std::__cxx11::string::~string((string *)&oss_planeId);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_planeId);
    poVar4 = std::operator<<((ostream *)&oss_planeId,"0x");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],char_const(&)[8],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&contents,(char (*) [9])"uint64_t",(char (*) [8])"planeId",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_polygonBufferIndex);
    std::__cxx11::string::~string((string *)&oss_polygonBufferIndex);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_polygonBufferIndex);
    poVar4 = std::operator<<((ostream *)&oss_polygonBufferIndex,"0x");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],char_const(&)[19],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&contents,(char (*) [9])"uint32_t",(char (*) [19])"polygonBufferIndex",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_polygonBuffer);
    std::__cxx11::string::~string((string *)&oss_polygonBuffer);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_polygonBuffer);
    *(uint *)((long)auStack_5f0 + *(long *)(_oss_polygonBuffer + -0x18)) =
         *(uint *)((long)auStack_5f0 + *(long *)(_oss_polygonBuffer + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&oss_polygonBuffer);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[33],char_const(&)[14],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&contents,(char (*) [33])0x21772d,(char (*) [14])"polygonBuffer",&local_628);
    std::__cxx11::string::~string((string *)&local_628);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_640,&contents);
    ApiDumpLayerRecordContent(&local_640);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_640);
    XVar2 = (**(code **)(lVar5 + 0x9b0))
                      (planeDetector_local,planeId,polygonBufferIndex,polygonBuffer);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_polygonBuffer);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_polygonBufferIndex);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_planeId);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_planeDetector);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&contents);
  return XVar2;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL ApiDumpLayerXrGetPlanePolygonBufferEXT(
    XrPlaneDetectorEXT planeDetector,
    uint64_t planeId,
    uint32_t polygonBufferIndex,
    XrPlaneDetectorPolygonBufferEXT* polygonBuffer) {
    XrResult result = XR_SUCCESS;
    try {
        // Generate output for this command
        std::vector<std::tuple<std::string, std::string, std::string>> contents;
        XrGeneratedDispatchTable *gen_dispatch_table = nullptr;

        {
            std::unique_lock<std::mutex> mlock(g_planedetectorext_dispatch_mutex);
            auto map_iter = g_planedetectorext_dispatch_map.find(planeDetector);
            if (map_iter == g_planedetectorext_dispatch_map.end()) {
                return XR_ERROR_VALIDATION_FAILURE;
            }
            gen_dispatch_table = map_iter->second;
        }

        contents.emplace_back("XrResult", "xrGetPlanePolygonBufferEXT", "");
        std::ostringstream oss_planeDetector;
        oss_planeDetector << std::hex << reinterpret_cast<const void*>(planeDetector);
        contents.emplace_back("XrPlaneDetectorEXT", "planeDetector", oss_planeDetector.str());
        std::ostringstream oss_planeId;
        oss_planeId << "0x" << std::hex << (planeId);
        contents.emplace_back("uint64_t", "planeId", oss_planeId.str());
        std::ostringstream oss_polygonBufferIndex;
        oss_polygonBufferIndex << "0x" << std::hex << (polygonBufferIndex);
        contents.emplace_back("uint32_t", "polygonBufferIndex", oss_polygonBufferIndex.str());
        std::ostringstream oss_polygonBuffer;
        oss_polygonBuffer << std::hex << reinterpret_cast<const void*>(polygonBuffer);
        contents.emplace_back("XrPlaneDetectorPolygonBufferEXT*", "polygonBuffer", oss_polygonBuffer.str());
        ApiDumpLayerRecordContent(contents);

        result = gen_dispatch_table->GetPlanePolygonBufferEXT(planeDetector, planeId, polygonBufferIndex, polygonBuffer);
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}